

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O0

void __thiscall SBarInfo::ParseMugShotBlock(SBarInfo *this,FScanner *sc,FMugShotState *state)

{
  bool bVar1;
  size_t sVar2;
  bool local_69;
  bool negative;
  byte local_39;
  undefined1 local_38 [7];
  bool multiframe;
  FMugShotFrame frame;
  FMugShotState *state_local;
  FScanner *sc_local;
  SBarInfo *this_local;
  
  frame._16_8_ = state;
  FScanner::MustGetToken(sc,0x7b);
  while (bVar1 = FScanner::CheckToken(sc,0x7d), ((bVar1 ^ 0xffU) & 1) != 0) {
    FMugShotFrame::FMugShotFrame((FMugShotFrame *)local_38);
    local_39 = 0;
    bVar1 = FScanner::CheckToken(sc,0x7b);
    if (bVar1) {
      local_39 = 1;
    }
    do {
      FScanner::MustGetToken(sc,0x101);
      sVar2 = strlen(sc->String);
      if (5 < sVar2) {
        FScanner::ScriptError(sc,"MugShot frames cannot exceed 5 characters.");
      }
      FString::FString((FString *)&stack0xffffffffffffffa8,sc->String);
      TArray<FString,_FString>::Push
                ((TArray<FString,_FString> *)local_38,(FString *)&stack0xffffffffffffffa8);
      FString::~FString((FString *)&stack0xffffffffffffffa8);
      local_69 = false;
      if ((local_39 & 1) != 0) {
        local_69 = FScanner::CheckToken(sc,0x2c);
      }
    } while (local_69 != false);
    if ((local_39 & 1) != 0) {
      FScanner::MustGetToken(sc,0x7d);
    }
    bVar1 = FScanner::CheckToken(sc,0x2d);
    FScanner::MustGetToken(sc,0x104);
    frame.Graphic.Most = (-(uint)bVar1 | 1) * sc->Number;
    FScanner::MustGetToken(sc,0x3b);
    TArray<FMugShotFrame,_FMugShotFrame>::Push
              ((TArray<FMugShotFrame,_FMugShotFrame> *)(frame._16_8_ + 0x18),
               (FMugShotFrame *)local_38);
    FMugShotFrame::~FMugShotFrame((FMugShotFrame *)local_38);
  }
  return;
}

Assistant:

void SBarInfo::ParseMugShotBlock(FScanner &sc, FMugShotState &state)
{
	sc.MustGetToken('{');
	while(!sc.CheckToken('}'))
	{
		FMugShotFrame frame;
		bool multiframe = false;
		if(sc.CheckToken('{'))
			multiframe = true;
		do
		{
			sc.MustGetToken(TK_Identifier);
			if(strlen(sc.String) > 5)
				sc.ScriptError("MugShot frames cannot exceed 5 characters.");
			frame.Graphic.Push(sc.String);
		}
		while(multiframe && sc.CheckToken(','));
		if(multiframe)
			sc.MustGetToken('}');
		bool negative = sc.CheckToken('-');
		sc.MustGetToken(TK_IntConst);
		frame.Delay = (negative ? -1 : 1)*sc.Number;
		sc.MustGetToken(';');
		state.Frames.Push(frame);
	}
}